

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::IGXMLScanner::updateNSMap
          (IGXMLScanner *this,XMLCh *attrName,XMLCh *attrValue,int colonOfs)

{
  XMLBufferMgr *this_00;
  XMLCh *str1;
  XMLStringPool *pXVar1;
  bool bVar2;
  uint uriId;
  XMLBuffer *toFill;
  Codes CVar3;
  XMLCh *str1_00;
  XMLBufBid bbNormal;
  XMLBufBid local_40;
  
  this_00 = &(this->super_XMLScanner).fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_00);
  local_40.fBuffer = toFill;
  local_40.fMgr = this_00;
  normalizeAttRawValue(this,attrName,attrValue,toFill);
  str1 = toFill->fBuffer;
  str1[toFill->fIndex] = L'\0';
  if (colonOfs == -1) {
    str1_00 = L"";
  }
  else {
    str1_00 = attrName + (long)colonOfs + 1;
    bVar2 = XMLString::equals(str1_00,(XMLCh *)XMLUni::fgXMLNSString);
    CVar3 = NoUseOfxmlnsAsPrefix;
    if (bVar2) {
LAB_002ac935:
      XMLScanner::emitError(&this->super_XMLScanner,CVar3);
    }
    else {
      bVar2 = XMLString::equals(str1_00,L"xml");
      if (bVar2) {
        bVar2 = XMLString::equals(str1,(XMLCh *)XMLUni::fgXMLURIName);
        CVar3 = PrefixXMLNotMatchXMLURI;
        if (!bVar2) goto LAB_002ac935;
      }
    }
    if ((*str1 == L'\0') && ((this->super_XMLScanner).fXMLVersion == XMLV1_0)) {
      XMLScanner::emitError
                (&this->super_XMLScanner,NoEmptyStrNamespace,attrName,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
  }
  bVar2 = XMLString::equals(str1,(XMLCh *)XMLUni::fgXMLNSURIName);
  CVar3 = NoUseOfxmlnsURI;
  if (!bVar2) {
    bVar2 = XMLString::equals(str1,(XMLCh *)XMLUni::fgXMLURIName);
    if (!bVar2) goto LAB_002ac9e8;
    bVar2 = XMLString::equals(str1_00,L"xml");
    CVar3 = XMLURINotMatchXMLPrefix;
    if (bVar2) goto LAB_002ac9e8;
  }
  XMLScanner::emitError(&this->super_XMLScanner,CVar3);
LAB_002ac9e8:
  pXVar1 = (this->super_XMLScanner).fURIStringPool;
  uriId = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,str1);
  ElemStack::addPrefix(&(this->super_XMLScanner).fElemStack,str1_00,uriId);
  XMLBufBid::~XMLBufBid(&local_40);
  return;
}

Assistant:

void IGXMLScanner::updateNSMap(const  XMLCh* const    attrName
                            , const XMLCh* const    attrValue
                            , const int colonOfs)
{
    // We need a buffer to normalize the attribute value into
    XMLBufBid bbNormal(&fBufMgr);
    XMLBuffer& normalBuf = bbNormal.getBuffer();

    //  Normalize the value into the passed buffer. In this case, we don't
    //  care about the return value. An error was issued for the error, which
    //  is all we care about here.
    normalizeAttRawValue(attrName, attrValue, normalBuf);
    XMLCh* namespaceURI = normalBuf.getRawBuffer();

    //  We either have the default prefix (""), or we point it into the attr
    //  name parameter. Note that the xmlns is not the prefix we care about
    //  here. To us, the 'prefix' is really the local part of the attrName
    //  parameter.
    //
    //  Check 1. xxx is not xmlns
    //        2. if xxx is xml, then yyy must match XMLUni::fgXMLURIName, and vice versa
    //        3. yyy is not XMLUni::fgXMLNSURIName
    //        4. if xxx is not null, then yyy cannot be an empty string.
    const XMLCh* prefPtr = XMLUni::fgZeroLenString;
    if (colonOfs != -1) {
        prefPtr = &attrName[colonOfs + 1];

        if (XMLString::equals(prefPtr, XMLUni::fgXMLNSString))
            emitError(XMLErrs::NoUseOfxmlnsAsPrefix);
        else if (XMLString::equals(prefPtr, XMLUni::fgXMLString)) {
            if (!XMLString::equals(namespaceURI, XMLUni::fgXMLURIName))
                emitError(XMLErrs::PrefixXMLNotMatchXMLURI);
        }

        if (!namespaceURI)
            emitError(XMLErrs::NoEmptyStrNamespace, attrName);
        else if(!*namespaceURI && fXMLVersion == XMLReader::XMLV1_0)
            emitError(XMLErrs::NoEmptyStrNamespace, attrName);
    }

    if (XMLString::equals(namespaceURI, XMLUni::fgXMLNSURIName))
        emitError(XMLErrs::NoUseOfxmlnsURI);
    else if (XMLString::equals(namespaceURI, XMLUni::fgXMLURIName)) {
        if (!XMLString::equals(prefPtr, XMLUni::fgXMLString))
            emitError(XMLErrs::XMLURINotMatchXMLPrefix);
    }

    //  Ok, we have to get the unique id for the attribute value, which is the
    //  URI that this value should be mapped to. The validator has the
    //  namespace string pool, so we ask him to find or add this new one. Then
    //  we ask the element stack to add this prefix to URI Id mapping.
    fElemStack.addPrefix
    (
        prefPtr
        , fURIStringPool->addOrFind(namespaceURI)
    );
}